

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularPriorityQueue.hpp
# Opt level: O2

void __thiscall CircularPriorityQueue<int>::pop(CircularPriorityQueue<int> *this)

{
  Node<int> *this_00;
  bool bVar1;
  Node<int> *pNVar2;
  
  pNVar2 = getPrevPriorNode(this);
  this_00 = pNVar2->next;
  std::mutex::lock(&this_00->usedMutex);
  bVar1 = Node<int>::pop(this_00);
  if ((bVar1) && (pNVar2->next != this_00->next)) {
    pNVar2->next = this_00->next;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this_00->usedMutex);
  return;
}

Assistant:

void pop() {
        Node<T> *prev = getPrevPriorNode();
        Node<T> *nodeToPop = prev->next;

        nodeToPop->usedMutex.lock();
        bool needToDelete = nodeToPop->pop();
        if (needToDelete && prev->next != nodeToPop->next) {
            prev->next = nodeToPop->next;
        }
        nodeToPop->usedMutex.unlock();
    }